

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaDeviceMemoryBlock::CheckCorruption(VmaDeviceMemoryBlock *this,VmaAllocator hAllocator)

{
  undefined8 *in_RDI;
  uint32_t unaff_retaddr;
  VmaAllocator in_stack_00000008;
  VmaDeviceMemoryBlock *in_stack_00000010;
  VkResult res;
  void *pData;
  undefined4 local_4;
  
  local_4 = Map(this,hAllocator,pData._4_4_,&in_stack_00000010->m_pMetadata);
  if (local_4 == VK_SUCCESS) {
    local_4 = (**(code **)(*(long *)*in_RDI + 0x90))((long *)*in_RDI,0);
    Unmap(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  }
  return local_4;
}

Assistant:

VkResult VmaDeviceMemoryBlock::CheckCorruption(VmaAllocator hAllocator)
{
    void* pData = nullptr;
    VkResult res = Map(hAllocator, 1, &pData);
    if (res != VK_SUCCESS)
    {
        return res;
    }

    res = m_pMetadata->CheckCorruption(pData);

    Unmap(hAllocator, 1);

    return res;
}